

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# benchmark.h
# Opt level: O0

time_double
time_function<unsigned_short,libdivide::divider<unsigned_short,(libdivide::Branching)0>>
          (random_numerators<unsigned_short> *vals,
          divider<unsigned_short,_(libdivide::Branching)0> denom,
          pFuncToTime<unsigned_short,_libdivide::divider<unsigned_short>_> timeFunc)

{
  time_double tVar1;
  uint64_t uVar2;
  code *in_RDX;
  undefined4 in_ESI;
  undefined8 in_RDI;
  timer t;
  time_double tresult;
  timer local_48;
  code *local_28;
  undefined8 local_20;
  undefined2 local_13;
  undefined1 local_11;
  uint64_t local_8;
  
  local_13 = (undefined2)in_ESI;
  local_11 = (undefined1)((uint)in_ESI >> 0x10);
  local_28 = in_RDX;
  local_20 = in_RDI;
  timer::timer(&local_48);
  timer::start((timer *)0x101769);
  local_8 = (*local_28)(local_20,&local_13);
  timer::stop((timer *)0x101789);
  uVar2 = timer::duration_nano(&local_48);
  tVar1.result = local_8;
  tVar1.time = uVar2;
  return tVar1;
}

Assistant:

NOINLINE static time_double time_function(
    const random_numerators<IntT> &vals, DenomT denom, pFuncToTime<IntT, DenomT> timeFunc) {
    time_double tresult;

    timer t;
    t.start();
    tresult.result = timeFunc(vals, denom);
    t.stop();
    tresult.time = t.duration_nano();
    return tresult;
}